

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

KOption getoption(Header *h,char **fmt,int *size)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  KOption KVar4;
  
  pcVar2 = *fmt;
  *fmt = pcVar2 + 1;
  cVar1 = *pcVar2;
  *size = 0;
  switch(cVar1) {
  case 'b':
    *size = 1;
    goto LAB_00116d4e;
  case 'c':
    iVar3 = getnum(fmt,-1);
    *size = iVar3;
    KVar4 = Kchar;
    if (iVar3 == -1) {
      luaL_error(h->L,"missing size for format option \'c\'");
    }
    break;
  case 'd':
  case 'n':
    *size = 8;
    goto LAB_00116d00;
  case 'e':
  case 'g':
  case 'k':
  case 'm':
  case 'o':
  case 'p':
  case 'q':
  case 'r':
  case 't':
  case 'u':
  case 'v':
  case 'w':
  case 'y':
switchD_00116c79_caseD_65:
    luaL_error(h->L,"invalid format option \'%c\'",(ulong)(uint)(int)cVar1);
    return Knop;
  case 'f':
    *size = 4;
LAB_00116d00:
    KVar4 = Kfloat;
    break;
  case 'h':
    *size = 2;
    goto LAB_00116d4e;
  case 'i':
    iVar3 = getnumlimit(h,fmt,4);
    *size = iVar3;
    goto LAB_00116d4e;
  case 'j':
  case 'l':
    *size = 8;
LAB_00116d4e:
    KVar4 = Kint;
    break;
  case 's':
    iVar3 = getnumlimit(h,fmt,8);
    *size = iVar3;
    KVar4 = Kstring;
    break;
  case 'x':
    *size = 1;
    KVar4 = Kpadding;
    break;
  case 'z':
    KVar4 = Kzstr;
    break;
  default:
    switch(cVar1) {
    case '<':
    case '=':
      h->islittle = 1;
      return Knop;
    case '>':
      h->islittle = 0;
      return Knop;
    case '?':
    case '@':
    case 'A':
    case 'C':
    case 'D':
    case 'E':
    case 'F':
    case 'G':
    case 'K':
      goto switchD_00116c79_caseD_65;
    case 'B':
      *size = 1;
      break;
    case 'H':
      *size = 2;
      break;
    case 'I':
      iVar3 = getnumlimit(h,fmt,4);
      *size = iVar3;
      break;
    default:
      if (cVar1 == ' ') {
        return Knop;
      }
      if (cVar1 == '!') {
        iVar3 = getnumlimit(h,fmt,8);
        h->maxalign = iVar3;
        return Knop;
      }
      if (cVar1 != 'T') {
        if (cVar1 == 'X') {
          return Kpaddalign;
        }
        goto switchD_00116c79_caseD_65;
      }
    case 'J':
    case 'L':
      *size = 8;
    }
    KVar4 = Kuint;
  }
  return KVar4;
}

Assistant:

static KOption getoption(Header *h, const char **fmt, int *size) {
    int opt = *((*fmt)++);
    *size = 0;  /* default */
    switch (opt) {
        case 'b':
            *size = sizeof(char);
            return Kint;
        case 'B':
            *size = sizeof(char);
            return Kuint;
        case 'h':
            *size = sizeof(short);
            return Kint;
        case 'H':
            *size = sizeof(short);
            return Kuint;
        case 'l':
            *size = sizeof(long);
            return Kint;
        case 'L':
            *size = sizeof(long);
            return Kuint;
        case 'j':
            *size = sizeof(lua_Integer);
            return Kint;
        case 'J':
            *size = sizeof(lua_Integer);
            return Kuint;
        case 'T':
            *size = sizeof(size_t);
            return Kuint;
        case 'f':
            *size = sizeof(float);
            return Kfloat;
        case 'd':
            *size = sizeof(double);
            return Kfloat;
        case 'n':
            *size = sizeof(lua_Number);
            return Kfloat;
        case 'i':
            *size = getnumlimit(h, fmt, sizeof(int));
            return Kint;
        case 'I':
            *size = getnumlimit(h, fmt, sizeof(int));
            return Kuint;
        case 's':
            *size = getnumlimit(h, fmt, sizeof(size_t));
            return Kstring;
        case 'c':
            *size = getnum(fmt, -1);
            if (*size == -1)
                luaL_error(h->L, "missing size for format option 'c'");
            return Kchar;
        case 'z':
            return Kzstr;
        case 'x':
            *size = 1;
            return Kpadding;
        case 'X':
            return Kpaddalign;
        case ' ':
            break;
        case '<':
            h->islittle = 1;
            break;
        case '>':
            h->islittle = 0;
            break;
        case '=':
            h->islittle = nativeendian.little;
            break;
        case '!':
            h->maxalign = getnumlimit(h, fmt, MAXALIGN);
            break;
        default:
            luaL_error(h->L, "invalid format option '%c'", opt);
    }
    return Knop;
}